

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

DecodePsbtInputStruct * __thiscall
cfd::api::json::DecodePsbtInput::ConvertToStruct
          (DecodePsbtInputStruct *__return_storage_ptr__,DecodePsbtInput *this)

{
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> local_138;
  undefined1 local_118 [8];
  _Alloc_hider _Stack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8 [8];
  _Alloc_hider local_f0;
  char local_e8 [8];
  char local_e0 [8];
  undefined1 local_d8 [8];
  undefined1 auStack_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [24];
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  undefined1 local_60 [8];
  undefined1 local_58 [32];
  _Alloc_hider local_38;
  
  DecodePsbtInputStruct::DecodePsbtInputStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  DecodeRawTransactionResponse::ConvertToStruct
            ((DecodeRawTransactionResponseStruct *)local_118,&this->non_witness_utxo_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->non_witness_utxo,(string *)local_118);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->non_witness_utxo).hash,local_f8);
  (__return_storage_ptr__->non_witness_utxo).locktime = auStack_d0._8_4_;
  (__return_storage_ptr__->non_witness_utxo).version = local_d8._0_4_;
  (__return_storage_ptr__->non_witness_utxo).size = local_d8._4_4_;
  (__return_storage_ptr__->non_witness_utxo).vsize = auStack_d0._0_4_;
  (__return_storage_ptr__->non_witness_utxo).weight = auStack_d0._4_4_;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->non_witness_utxo).vin.
       super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->non_witness_utxo).vin.
       super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->non_witness_utxo).vin.
       super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->non_witness_utxo).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c0._0_8_;
  (__return_storage_ptr__->non_witness_utxo).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c0._8_8_;
  (__return_storage_ptr__->non_witness_utxo).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b0;
  local_c0._0_8_ = (pointer)0x0;
  local_c0._8_8_ = (pointer)0x0;
  local_b0 = (undefined1  [8])0x0;
  std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  ~vector(&local_138);
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->non_witness_utxo).vout.
                super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->non_witness_utxo).vout.
                super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->non_witness_utxo).vout.
                super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->non_witness_utxo).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
  (__return_storage_ptr__->non_witness_utxo).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_a0._0_8_;
  (__return_storage_ptr__->non_witness_utxo).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_a0._8_8_;
  local_a8 = (undefined1  [8])0x0;
  auStack_a0._0_8_ = (pointer)0x0;
  auStack_a0._8_8_ = (pointer)0x0;
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  ~vector((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
           *)&local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->non_witness_utxo).ignore_items._M_t);
  if ((_Base_ptr)local_88._8_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->non_witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_88._0_4_;
    (__return_storage_ptr__->non_witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = (_Base_ptr)local_88._8_8_;
    (__return_storage_ptr__->non_witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = (_Base_ptr)local_88._16_8_;
    (__return_storage_ptr__->non_witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = (_Base_ptr)aStack_70._M_allocated_capacity;
    *(_Rb_tree_header **)(local_88._8_8_ + 8) =
         &(__return_storage_ptr__->non_witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header
    ;
    (__return_storage_ptr__->non_witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = aStack_70._8_8_;
    local_88._8_8_ = (_Base_ptr)0x0;
    aStack_70._8_8_ = 0;
    local_88._16_8_ = (_Base_ptr)local_88;
    aStack_70._M_allocated_capacity = (size_type)(_Base_ptr)local_88;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_a0 + 0x10));
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  ~vector((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
           *)local_a8);
  std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  ~vector((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *
          )local_c0);
  if (local_f8 != (string  [8])local_e8) {
    operator_delete((void *)local_f8);
  }
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118);
  }
  DecodePsbtUtxo::ConvertToStruct((DecodePsbtUtxoStruct *)local_118,&this->witness_utxo_);
  (__return_storage_ptr__->witness_utxo).amount = (int64_t)local_118;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_utxo).script_pub_key,(string *)&_Stack_110)
  ;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_utxo).script_pub_key.hex,
             (string *)&local_f0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_utxo).script_pub_key.type,
             (string *)auStack_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_utxo).script_pub_key.address,
             (string *)local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t);
  if ((_Base_ptr)local_88._8_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = local_88._0_4_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = local_88._8_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = local_88._16_8_;
    *(size_type *)
     ((long)&(__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = aStack_70._M_allocated_capacity;
    *(_Rb_tree_header **)(local_88._8_8_ + 8) =
         &(__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t._M_impl.
          super__Rb_tree_header;
    (__return_storage_ptr__->witness_utxo).script_pub_key.ignore_items._M_t._M_impl.
    super__Rb_tree_header._M_node_count = aStack_70._8_8_;
    local_88._8_8_ = (_Base_ptr)0x0;
    aStack_70._8_8_ = 0;
    local_88._16_8_ = (_Base_ptr)local_88;
    aStack_70._M_allocated_capacity = (size_type)(_Base_ptr)local_88;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->witness_utxo).ignore_items._M_t);
  if ((_Base_ptr)local_58._8_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
    ._M_color = local_58._0_4_;
    (__return_storage_ptr__->witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
    ._M_parent = (_Base_ptr)local_58._8_8_;
    (__return_storage_ptr__->witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
    ._M_left = (_Base_ptr)local_58._16_8_;
    (__return_storage_ptr__->witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
    ._M_right = (_Base_ptr)local_58._24_8_;
    *(_Rb_tree_header **)(local_58._8_8_ + 8) =
         &(__return_storage_ptr__->witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->witness_utxo).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = (size_t)local_38._M_p;
    local_58._8_8_ = (_Base_ptr)0x0;
    local_38._M_p = (pointer)0x0;
    local_58._16_8_ = (_Base_ptr)local_58;
    local_58._24_8_ = (_Base_ptr)local_58;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_a0 + 0x10));
  if (local_b0 != (undefined1  [8])auStack_a0) {
    operator_delete((void *)local_b0);
  }
  if ((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *)
      CONCAT44(auStack_d0._4_4_,auStack_d0._0_4_) !=
      (vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *)
      local_c0) {
    operator_delete((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                     *)CONCAT44(auStack_d0._4_4_,auStack_d0._0_4_));
  }
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  if (_Stack_110._M_p != local_108._M_local_buf + 8) {
    operator_delete(_Stack_110._M_p);
  }
  core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
  ConvertToStruct((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)
                  &local_138,&this->partial_signatures_);
  local_118 = (undefined1  [8])
              (__return_storage_ptr__->partial_signatures).
              super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>.
              _M_impl.super__Vector_impl_data._M_start;
  _Stack_110._M_p =
       (pointer)(__return_storage_ptr__->partial_signatures).
                super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_108._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->partial_signatures).
       super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->partial_signatures).
  super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->partial_signatures).
  super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->partial_signatures).
  super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::~vector
            ((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)local_118)
  ;
  std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::~vector
            ((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)&local_138
            );
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->sighash);
  PsbtScriptData::ConvertToStruct((PsbtScriptDataStruct *)local_118,&this->redeem_script_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->redeem_script,(string *)local_118);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->redeem_script).hex,local_f8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->redeem_script).type,(string *)local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->redeem_script).ignore_items._M_t);
  if (local_a8 != (undefined1  [8])0x0) {
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_b0._0_4_;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = (_Base_ptr)local_a8;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = (_Base_ptr)auStack_a0._0_8_;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = (_Base_ptr)auStack_a0._8_8_;
    *(_Rb_tree_header **)((long)local_a8 + 8) =
         &(__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = auStack_a0._16_8_;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._16_8_ = 0;
    auStack_a0._0_8_ = (pointer)local_b0;
    auStack_a0._8_8_ = (pointer)local_b0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c0 + 8));
  if (local_d8 != (undefined1  [8])(auStack_d0 + 8)) {
    operator_delete((void *)local_d8);
  }
  if (local_f8 != (string  [8])local_e8) {
    operator_delete((void *)local_f8);
  }
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118);
  }
  PsbtScriptData::ConvertToStruct((PsbtScriptDataStruct *)local_118,&this->witness_script_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->witness_script,(string *)local_118);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->witness_script).hex,local_f8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_script).type,(string *)local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->witness_script).ignore_items._M_t);
  if (local_a8 != (undefined1  [8])0x0) {
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_b0._0_4_;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = (_Base_ptr)local_a8;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = (_Base_ptr)auStack_a0._0_8_;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = (_Base_ptr)auStack_a0._8_8_;
    *(_Rb_tree_header **)((long)local_a8 + 8) =
         &(__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = auStack_a0._16_8_;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._16_8_ = 0;
    auStack_a0._0_8_ = (pointer)local_b0;
    auStack_a0._8_8_ = (pointer)local_b0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c0 + 8));
  if (local_d8 != (undefined1  [8])(auStack_d0 + 8)) {
    operator_delete((void *)local_d8);
  }
  if (local_f8 != (string  [8])local_e8) {
    operator_delete((void *)local_f8);
  }
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118);
  }
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)&local_138,
             &this->bip32_derivs_);
  local_118 = (undefined1  [8])
              (__return_storage_ptr__->bip32_derivs).
              super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
              super__Vector_impl_data._M_start;
  _Stack_110._M_p =
       (pointer)(__return_storage_ptr__->bip32_derivs).
                super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_108._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->bip32_derivs).
       super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)local_118);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)&local_138);
  DecodeUnlockingScript::ConvertToStruct
            ((DecodeUnlockingScriptStruct *)local_118,&this->final_scriptsig_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->final_scriptsig,(string *)local_118);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->final_scriptsig).hex,local_f8)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->final_scriptsig).ignore_items._M_t);
  if ((_Base_ptr)auStack_d0._8_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->final_scriptsig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = auStack_d0._0_4_;
    (__return_storage_ptr__->final_scriptsig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = (_Base_ptr)auStack_d0._8_8_;
    (__return_storage_ptr__->final_scriptsig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = (_Base_ptr)local_c0._0_8_;
    (__return_storage_ptr__->final_scriptsig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = (_Base_ptr)local_c0._8_8_;
    *(_Rb_tree_header **)(auStack_d0._8_8_ + 8) =
         &(__return_storage_ptr__->final_scriptsig).ignore_items._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->final_scriptsig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = (size_t)local_b0;
    auStack_d0._8_8_ = (_Base_ptr)0x0;
    local_c0._0_8_ = auStack_d0;
    local_b0 = (undefined1  [8])0x0;
    local_c0._8_8_ = local_c0._0_8_;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  if (local_f8 != (string  [8])local_e8) {
    operator_delete((void *)local_f8);
  }
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118);
  }
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_138,&this->final_scriptwitness_);
  local_118 = (undefined1  [8])
              (__return_storage_ptr__->final_scriptwitness).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  _Stack_110._M_p =
       (pointer)(__return_storage_ptr__->final_scriptwitness).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_108._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->final_scriptwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->final_scriptwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       &(local_138.
         super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
         ._M_impl.super__Vector_impl_data._M_start)->coinbase;
  (__return_storage_ptr__->final_scriptwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       &(local_138.
         super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish)->coinbase;
  (__return_storage_ptr__->final_scriptwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       &(local_138.
         super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->coinbase;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_138);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_138,
             &this->unknown_);
  local_118 = (undefined1  [8])
              (__return_storage_ptr__->unknown).
              super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
              super__Vector_impl_data._M_start;
  _Stack_110._M_p =
       (pointer)(__return_storage_ptr__->unknown).
                super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_108._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_138.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)local_118);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtInputStruct DecodePsbtInput::ConvertToStruct() const {  // NOLINT
  DecodePsbtInputStruct result;
  result.non_witness_utxo_hex = non_witness_utxo_hex_;
  result.non_witness_utxo = non_witness_utxo_.ConvertToStruct();
  result.witness_utxo = witness_utxo_.ConvertToStruct();
  result.partial_signatures = partial_signatures_.ConvertToStruct();
  result.sighash = sighash_;
  result.redeem_script = redeem_script_.ConvertToStruct();
  result.witness_script = witness_script_.ConvertToStruct();
  result.bip32_derivs = bip32_derivs_.ConvertToStruct();
  result.final_scriptsig = final_scriptsig_.ConvertToStruct();
  result.final_scriptwitness = final_scriptwitness_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}